

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

NameType * __thiscall
(anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[14]>
          (Db *this,char (*args) [14])

{
  NameType *this_00;
  StringView local_28;
  char (*local_18) [14];
  char (*args_local) [14];
  Db *this_local;
  
  local_18 = args;
  args_local = (char (*) [14])this;
  this_00 = (NameType *)
            anon_unknown.dwarf_2f151d::BumpPointerAllocator::allocate
                      ((BumpPointerAllocator *)(this + 0x2f0),0x20);
  StringView::StringView(&local_28,*local_18);
  anon_unknown.dwarf_2f151d::NameType::NameType(this_00,local_28);
  return this_00;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }